

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDDOMParser.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XSDDOMParser::startAnnotation
          (XSDDOMParser *this,XMLElementDecl *elemDecl,RefVectorOf<xercesc_4_0::XMLAttr> *attrList,
          XMLSize_t attrCount)

{
  XMLBuffer *this_00;
  short *psVar1;
  short *psVar2;
  XMLCh XVar3;
  RefHashTableOf<xercesc_4_0::XMLStringPool::PoolElem,_xercesc_4_0::StringHasher> *pRVar4;
  undefined2 *puVar5;
  XMLSize_t XVar6;
  XMLSize_t XVar7;
  uint *puVar8;
  XMLScanner *pXVar9;
  ulong uVar10;
  bool bVar11;
  int iVar12;
  XMLCh *pXVar13;
  XMLAttr *this_01;
  XMLCh *pXVar14;
  ulong uVar15;
  RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *pRVar16;
  PoolElem *pPVar17;
  ValueVectorOf<xercesc_4_0::PrefMapElem_*> *this_02;
  PrefMapElem **ppPVar18;
  IllegalArgumentException *this_03;
  XMLCh *pXVar19;
  uint uVar20;
  XMLCh XVar21;
  short sVar22;
  long lVar23;
  ulong uVar24;
  ValueVectorOf<unsigned_int> *pVVar25;
  XMLSize_t XVar26;
  
  this_00 = &this->fAnnotationBuf;
  if ((this->fAnnotationBuf).fIndex == (this->fAnnotationBuf).fCapacity) {
    XMLBuffer::ensureCapacity(this_00,1);
  }
  XVar26 = (this->fAnnotationBuf).fIndex;
  (this->fAnnotationBuf).fIndex = XVar26 + 1;
  (this->fAnnotationBuf).fBuffer[XVar26] = L'<';
  pXVar13 = QName::getRawName(elemDecl->fElementName);
  XMLBuffer::append(this_00,pXVar13);
  if ((this->fAnnotationBuf).fIndex == (this->fAnnotationBuf).fCapacity) {
    XMLBuffer::ensureCapacity(this_00,1);
  }
  XVar26 = (this->fAnnotationBuf).fIndex;
  (this->fAnnotationBuf).fIndex = XVar26 + 1;
  (this->fAnnotationBuf).fBuffer[XVar26] = L' ';
  this->fURIs->fCurCount = 0;
  if (attrCount != 0) {
    XVar26 = 0;
    do {
      this_01 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                          (&attrList->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,XVar26);
      pXVar13 = this_01->fValue;
      pXVar14 = this_01->fAttName->fLocalPart;
      if (pXVar14 == L"xmlns") {
LAB_00343486:
        pVVar25 = this->fURIs;
        for (pRVar16 = *((((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner)->
                         fElemStack).fPrefixPool.fHashTable)->fBucketList;
            pRVar16 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0;
            pRVar16 = pRVar16->fNext) {
          puVar5 = (undefined2 *)pRVar16->fKey;
          if (puVar5 == &XMLUni::fgZeroLenString) goto LAB_0034352b;
          sVar22 = 0;
          if (puVar5 == (undefined2 *)0x0) {
LAB_0034351e:
            if (sVar22 == 0) goto LAB_0034352b;
          }
          else {
            lVar23 = 0;
            do {
              psVar1 = (short *)((long)&XMLUni::fgZeroLenString + lVar23);
              if (*psVar1 == 0) {
                sVar22 = *(short *)((long)puVar5 + lVar23);
                goto LAB_0034351e;
              }
              psVar2 = (short *)((long)puVar5 + lVar23);
              lVar23 = lVar23 + 2;
            } while (*psVar1 == *psVar2);
          }
        }
        pRVar16 = (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0;
LAB_0034352b:
        if (pRVar16 == (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
LAB_003435a9:
          pPVar17 = (PoolElem *)0x0;
        }
        else {
          pPVar17 = pRVar16->fData;
        }
LAB_003435ab:
        if (pPVar17 == (PoolElem *)0x0) {
          uVar20 = 0;
        }
        else {
          uVar20 = pPVar17->fId;
        }
        ValueVectorOf<unsigned_int>::ensureExtraCapacity(pVVar25,1);
        XVar6 = pVVar25->fCurCount;
        pVVar25->fCurCount = XVar6 + 1;
        pVVar25->fElemList[XVar6] = uVar20;
      }
      else {
        pXVar19 = L"xmlns";
        if (pXVar14 == (XMLCh *)0x0) {
LAB_003433eb:
          if (*pXVar19 == L'\0') goto LAB_00343486;
        }
        else {
          pXVar19 = L"xmlns";
          do {
            XVar21 = *pXVar14;
            if (XVar21 == L'\0') goto LAB_003433eb;
            pXVar14 = pXVar14 + 1;
            XVar3 = *pXVar19;
            pXVar19 = pXVar19 + 1;
          } while (XVar21 == XVar3);
        }
        pXVar14 = XMLAttr::getQName(this_01);
        iVar12 = XMLString::compareNString(pXVar14,L"xmlns:",6);
        if (iVar12 == 0) {
          pVVar25 = this->fURIs;
          pXVar14 = this_01->fAttName->fLocalPart;
          pRVar4 = (((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner)->fElemStack).
                   fPrefixPool.fHashTable;
          if ((pXVar14 == (XMLCh *)0x0) || (uVar15 = (ulong)(ushort)*pXVar14, uVar15 == 0)) {
            uVar15 = 0;
          }
          else {
            XVar21 = pXVar14[1];
            if (XVar21 != L'\0') {
              pXVar19 = pXVar14 + 2;
              do {
                uVar15 = (ulong)(ushort)XVar21 + (uVar15 >> 0x18) + uVar15 * 0x26;
                XVar21 = *pXVar19;
                pXVar19 = pXVar19 + 1;
              } while (XVar21 != L'\0');
            }
            uVar15 = uVar15 % pRVar4->fHashModulus;
          }
          pRVar16 = pRVar4->fBucketList[uVar15];
          if (pRVar16 == (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
            pRVar16 = (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0;
          }
          else {
            do {
              bVar11 = StringHasher::equals
                                 ((StringHasher *)&pRVar4->field_0x30,pXVar14,pRVar16->fKey);
              if (bVar11) goto LAB_0034359a;
              pRVar16 = pRVar16->fNext;
            } while (pRVar16 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0)
            ;
            pRVar16 = (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0;
          }
LAB_0034359a:
          if (pRVar16 == (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0)
          goto LAB_003435a9;
          pPVar17 = pRVar16->fData;
          goto LAB_003435ab;
        }
      }
      pXVar14 = XMLAttr::getQName(this_01);
      XMLBuffer::append(this_00,pXVar14);
      if ((this->fAnnotationBuf).fIndex == (this->fAnnotationBuf).fCapacity) {
        XMLBuffer::ensureCapacity(this_00,1);
      }
      XVar7 = (this->fAnnotationBuf).fIndex;
      XVar6 = XVar7 + 1;
      (this->fAnnotationBuf).fIndex = XVar6;
      (this->fAnnotationBuf).fBuffer[XVar7] = L'=';
      if (XVar6 == (this->fAnnotationBuf).fCapacity) {
        XMLBuffer::ensureCapacity(this_00,1);
      }
      XVar6 = (this->fAnnotationBuf).fIndex;
      (this->fAnnotationBuf).fIndex = XVar6 + 1;
      (this->fAnnotationBuf).fBuffer[XVar6] = L'\"';
      XMLBuffer::append(this_00,pXVar13);
      if ((this->fAnnotationBuf).fIndex == (this->fAnnotationBuf).fCapacity) {
        XMLBuffer::ensureCapacity(this_00,1);
      }
      XVar7 = (this->fAnnotationBuf).fIndex;
      XVar6 = XVar7 + 1;
      (this->fAnnotationBuf).fIndex = XVar6;
      (this->fAnnotationBuf).fBuffer[XVar7] = L'\"';
      if (XVar6 == (this->fAnnotationBuf).fCapacity) {
        XMLBuffer::ensureCapacity(this_00,1);
      }
      XVar6 = (this->fAnnotationBuf).fIndex;
      (this->fAnnotationBuf).fIndex = XVar6 + 1;
      (this->fAnnotationBuf).fBuffer[XVar6] = L' ';
      XVar26 = XVar26 + 1;
    } while (XVar26 != attrCount);
  }
  this_02 = ElemStack::getNamespaceMap
                      (&((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner)->fElemStack
                      );
  if (this_02->fCurCount != 0) {
    XVar26 = 0;
    do {
      ppPVar18 = ValueVectorOf<xercesc_4_0::PrefMapElem_*>::elementAt(this_02,XVar26);
      uVar20 = (*ppPVar18)->fPrefId;
      uVar15 = this->fURIs->fCurCount;
      bVar11 = uVar15 != 0;
      if (uVar15 == 0) {
LAB_00343765:
        if (!bVar11) {
          pXVar9 = (this->super_XercesDOMParser).super_AbstractDOMParser.fScanner;
          if ((uVar20 == 0) || ((pXVar9->fElemStack).fPrefixPool.fCurId <= uVar20)) {
            this_03 = (IllegalArgumentException *)__cxa_allocate_exception(0x30);
            IllegalArgumentException::IllegalArgumentException
                      (this_03,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/StringPool.hpp"
                       ,0xa2,StrPool_IllegalId,(pXVar9->fElemStack).fPrefixPool.fMemoryManager);
            __cxa_throw(this_03,&IllegalArgumentException::typeinfo,XMLException::~XMLException);
          }
          pXVar13 = (pXVar9->fElemStack).fPrefixPool.fIdMap[uVar20]->fString;
          if (pXVar13 == L"") {
LAB_003437eb:
            pXVar13 = L"xmlns";
          }
          else {
            pXVar14 = L"";
            if (pXVar13 == (XMLCh *)0x0) {
LAB_003437ca:
              if (*pXVar14 == L'\0') goto LAB_003437eb;
            }
            else {
              pXVar14 = L"";
              pXVar19 = pXVar13;
              do {
                XVar21 = *pXVar19;
                if (XVar21 == L'\0') goto LAB_003437ca;
                pXVar19 = pXVar19 + 1;
                XVar3 = *pXVar14;
                pXVar14 = pXVar14 + 1;
              } while (XVar21 == XVar3);
            }
            XMLBuffer::append(this_00,L"xmlns:");
          }
          XMLBuffer::append(this_00,pXVar13);
          if ((this->fAnnotationBuf).fIndex == (this->fAnnotationBuf).fCapacity) {
            XMLBuffer::ensureCapacity(this_00,1);
          }
          XVar7 = (this->fAnnotationBuf).fIndex;
          XVar6 = XVar7 + 1;
          (this->fAnnotationBuf).fIndex = XVar6;
          (this->fAnnotationBuf).fBuffer[XVar7] = L'=';
          if (XVar6 == (this->fAnnotationBuf).fCapacity) {
            XMLBuffer::ensureCapacity(this_00,1);
          }
          XVar6 = (this->fAnnotationBuf).fIndex;
          (this->fAnnotationBuf).fIndex = XVar6 + 1;
          (this->fAnnotationBuf).fBuffer[XVar6] = L'\"';
          pXVar9 = (this->super_XercesDOMParser).super_AbstractDOMParser.fScanner;
          ppPVar18 = ValueVectorOf<xercesc_4_0::PrefMapElem_*>::elementAt(this_02,XVar26);
          pXVar13 = XMLScanner::getURIText(pXVar9,(*ppPVar18)->fURIId);
          XMLBuffer::append(this_00,pXVar13);
          if ((this->fAnnotationBuf).fIndex == (this->fAnnotationBuf).fCapacity) {
            XMLBuffer::ensureCapacity(this_00,1);
          }
          XVar7 = (this->fAnnotationBuf).fIndex;
          XVar6 = XVar7 + 1;
          (this->fAnnotationBuf).fIndex = XVar6;
          (this->fAnnotationBuf).fBuffer[XVar7] = L'\"';
          if (XVar6 == (this->fAnnotationBuf).fCapacity) {
            XMLBuffer::ensureCapacity(this_00,1);
          }
          XVar6 = (this->fAnnotationBuf).fIndex;
          (this->fAnnotationBuf).fIndex = XVar6 + 1;
          (this->fAnnotationBuf).fBuffer[XVar6] = L' ';
          pVVar25 = this->fURIs;
          ValueVectorOf<unsigned_int>::ensureExtraCapacity(pVVar25,1);
          XVar6 = pVVar25->fCurCount;
          pVVar25->fCurCount = XVar6 + 1;
          pVVar25->fElemList[XVar6] = uVar20;
        }
      }
      else {
        puVar8 = this->fURIs->fElemList;
        if (*puVar8 != uVar20) {
          uVar10 = 1;
          do {
            uVar24 = uVar10;
            if (uVar15 == uVar24) break;
            uVar10 = uVar24 + 1;
          } while (puVar8[uVar24] != uVar20);
          bVar11 = uVar24 < uVar15;
          goto LAB_00343765;
        }
      }
      XVar26 = XVar26 + 1;
    } while (XVar26 < this_02->fCurCount);
  }
  if ((this->fAnnotationBuf).fIndex == (this->fAnnotationBuf).fCapacity) {
    XMLBuffer::ensureCapacity(this_00,1);
  }
  XVar6 = (this->fAnnotationBuf).fIndex;
  XVar26 = XVar6 + 1;
  (this->fAnnotationBuf).fIndex = XVar26;
  (this->fAnnotationBuf).fBuffer[XVar6] = L'>';
  if (XVar26 == (this->fAnnotationBuf).fCapacity) {
    XMLBuffer::ensureCapacity(this_00,1);
  }
  XVar26 = (this->fAnnotationBuf).fIndex;
  (this->fAnnotationBuf).fIndex = XVar26 + 1;
  (this->fAnnotationBuf).fBuffer[XVar26] = L'\n';
  return;
}

Assistant:

void XSDDOMParser::startAnnotation( const XMLElementDecl&       elemDecl
                                  , const RefVectorOf<XMLAttr>& attrList
                                  , const XMLSize_t             attrCount)
{
    fAnnotationBuf.append(chOpenAngle);
	fAnnotationBuf.append(elemDecl.getFullName());
    fAnnotationBuf.append(chSpace);

    // attributes are a bit of a pain.  To get this right, we have to keep track
    // of the namespaces we've seen declared, then examine the namespace context
    // for other namespaces so that we can also include them.
    // optimized for simplicity and the case that not many
    // namespaces are declared on this annotation...
    fURIs->removeAllElements();
    for (XMLSize_t i=0; i < attrCount; i++) {

        const XMLAttr* oneAttrib = attrList.elementAt(i);
        const XMLCh* attrValue = oneAttrib->getValue();

        if (XMLString::equals(oneAttrib->getName(), XMLUni::fgXMLNSString))
            fURIs->addElement(fScanner->getPrefixId(XMLUni::fgZeroLenString));
        else  if (!XMLString::compareNString(oneAttrib->getQName(), XMLUni::fgXMLNSColonString, 6))
            fURIs->addElement(fScanner->getPrefixId(oneAttrib->getName()));

        fAnnotationBuf.append(oneAttrib->getQName());
        fAnnotationBuf.append(chEqual);
        fAnnotationBuf.append(chDoubleQuote);
        fAnnotationBuf.append(attrValue);
        fAnnotationBuf.append(chDoubleQuote);
        fAnnotationBuf.append(chSpace);
    }

    // now we have to look through currently in-scope namespaces to see what
    // wasn't declared here
    ValueVectorOf<PrefMapElem*>* namespaceContext = fScanner->getNamespaceContext();
    for (XMLSize_t j=0; j < namespaceContext->size(); j++)
    {
        unsigned int prefId = namespaceContext->elementAt(j)->fPrefId;

        if (!fURIs->containsElement(prefId)) {

            const XMLCh* prefix = fScanner->getPrefixForId(prefId);

            if (XMLString::equals(prefix, XMLUni::fgZeroLenString)) {
                fAnnotationBuf.append(XMLUni::fgXMLNSString);
            }
            else  {
                fAnnotationBuf.append(XMLUni::fgXMLNSColonString);
                fAnnotationBuf.append(prefix);
            }

            fAnnotationBuf.append(chEqual);
            fAnnotationBuf.append(chDoubleQuote);
            fAnnotationBuf.append(fScanner->getURIText(namespaceContext->elementAt(j)->fURIId));
            fAnnotationBuf.append(chDoubleQuote);
            fAnnotationBuf.append(chSpace);

            fURIs->addElement(prefId);
        }
    }

    fAnnotationBuf.append(chCloseAngle);
    fAnnotationBuf.append(chLF);
}